

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_get_exist_single(planck_unit_test_t *tc)

{
  undefined4 uVar1;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  bhdct_setup(tc,&handler,&dict,ion_fill_none);
  uVar1 = 0x1e;
  local_90 = uVar1;
  local_8c = uVar1;
  bhdct_insert(tc,&dict,&local_8c,&local_90,'\x01');
  local_98 = uVar1;
  local_94 = uVar1;
  bhdct_get(tc,&dict,&local_94,&local_98,'\0',1);
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_get_exist_single(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_none);

	bhdct_insert(tc, &dict, IONIZE(30, int), IONIZE(30, int), boolean_true);
	bhdct_get(tc, &dict, IONIZE(30, int), IONIZE(30, int), err_ok, 1);

	bhdct_takedown(tc, &dict);
}